

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
SubcommandProgram_CallbackOrder_Test::~SubcommandProgram_CallbackOrder_Test
          (SubcommandProgram_CallbackOrder_Test *this)

{
  SubcommandProgram_CallbackOrder_Test *this_local;
  
  ~SubcommandProgram_CallbackOrder_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(SubcommandProgram, CallbackOrder) {
    std::vector<int> callback_order;
    start->set_callback([&callback_order]() { callback_order.push_back(1); });
    stop->set_callback([&callback_order]() { callback_order.push_back(2); });

    args = {"start", "stop"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({1, 2}));

    app.reset();
    callback_order.clear();

    args = {"stop", "start"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({2, 1}));
}